

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O1

Expression __thiscall
dynet::FastLSTMBuilder::add_input_impl(FastLSTMBuilder *this,int prev,Expression *x)

{
  undefined8 *puVar1;
  bool bVar2;
  pointer pvVar3;
  long lVar4;
  pointer pEVar5;
  ulong uVar6;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *pvVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Expression EVar11;
  Expression in;
  Expression i_wt;
  Expression i_it;
  Expression i_crt;
  Expression ph_t;
  Expression i_ot;
  Expression i_h_tm1;
  Expression i_ft;
  ComputationGraph *local_198;
  pointer puStack_190;
  pointer local_180;
  Expression local_178;
  Expression local_168;
  Expression local_158;
  Expression local_148;
  FastLSTMBuilder *local_130;
  Expression local_128;
  undefined1 local_118 [80];
  Expression local_c8;
  pointer local_b8;
  pointer pCStack_b0;
  pointer local_a8;
  ulong local_a0;
  Expression local_98;
  Expression local_88;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_70;
  long local_68;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_60;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_58;
  Expression local_50;
  initializer_list<dynet::Expression> local_40;
  
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_118,
             (ulong)this->layers,(allocator_type *)&local_198);
  local_58 = &this->h;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)local_58,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_118)
  ;
  if ((ComputationGraph *)local_118._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_118._0_8_);
  }
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_118,
             (ulong)this->layers,(allocator_type *)&local_198);
  local_60 = &this->c;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)local_60,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_118)
  ;
  if ((ComputationGraph *)local_118._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_118._0_8_);
  }
  local_a8 = (this->h).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_180 = (this->c).
              super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_198 = x->pg;
  puStack_190 = *(pointer *)&x->i;
  if (this->layers != 0) {
    local_70 = &this->c0;
    lVar8 = 0;
    local_68 = (ulong)(uint)prev << 3;
    lVar9 = 0;
    local_a0 = 0;
    local_130 = this;
    do {
      pvVar3 = (this->param_vars).
               super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b8 = (pointer)0x0;
      pCStack_b0 = (pointer)0x0;
      local_88.pg = (ComputationGraph *)0x0;
      local_88.i = 0;
      local_88.graph_id = 0;
      bVar2 = this->has_initial_state;
      bVar10 = prev < 0;
      if (bVar10) {
        if ((bVar2 & 1U) != 0) {
          puVar1 = (undefined8 *)
                   ((long)&((local_130->h0).
                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar9);
          local_b8 = (pointer)*puVar1;
          pCStack_b0 = (pointer)puVar1[1];
          pvVar7 = local_70;
          goto LAB_00275a9a;
        }
      }
      else {
        puVar1 = (undefined8 *)
                 (*(long *)((long)&(((local_58->
                                     super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   )._M_impl + local_68 * 3) + lVar9);
        local_b8 = (pointer)*puVar1;
        pCStack_b0 = (pointer)puVar1[1];
        pvVar7 = (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 ((long)&(((local_60->
                           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl + local_68 * 3);
LAB_00275a9a:
        puVar1 = (undefined8 *)
                 ((long)&((pvVar7->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->pg + lVar9);
        local_88.pg = (ComputationGraph *)*puVar1;
        local_88._8_8_ = puVar1[1];
      }
      local_c8 = (Expression)ZEXT816(0);
      if (bVar10 && (bVar2 & 1U) == 0) {
        local_118._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar3->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar8) + 0x30);
        puVar1 = *(undefined8 **)
                  ((long)&(pvVar3->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar8);
        local_118._16_8_ = *puVar1;
        local_118._24_8_ = puVar1[1];
        local_118._32_8_ = local_198;
        local_118._40_8_ = puStack_190;
        local_168.i = 3;
        local_168.graph_id = 0;
        local_168.pg = (ComputationGraph *)local_118;
        local_c8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                             ((initializer_list<dynet::Expression> *)&local_168);
      }
      else {
        local_118._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar3->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar8) + 0x30);
        puVar1 = *(undefined8 **)
                  ((long)&(pvVar3->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar8);
        local_118._16_8_ = *puVar1;
        local_118._24_8_ = puVar1[1];
        local_118._32_8_ = local_198;
        local_118._40_8_ = puStack_190;
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar8);
        local_118._48_8_ = *(undefined8 *)(lVar4 + 0x10);
        local_118._56_8_ = *(undefined8 *)(lVar4 + 0x18);
        local_118._64_8_ = local_b8;
        local_118._72_8_ = pCStack_b0;
        local_98.i = 5;
        local_98.graph_id = 0;
        local_98.pg = (ComputationGraph *)local_118;
        local_168 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_98);
        local_148 = cmult((Expression *)
                          (*(long *)((long)&(pvVar3->
                                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                            )._M_impl.super__Vector_impl_data + lVar8) + 0x20),
                          &local_88);
        local_c8 = operator+(&local_168,&local_148);
      }
      local_168 = logistic(&local_c8);
      local_98 = operator-(1.0,&local_168);
      local_148 = (Expression)ZEXT816(0);
      if (bVar10 && (bVar2 & 1U) == 0) {
        local_118._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar3->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar8) + 0xa0);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar8);
        local_118._16_8_ = *(undefined8 *)(lVar4 + 0x80);
        local_118._24_8_ = *(undefined8 *)(lVar4 + 0x88);
        local_178.i = 3;
        local_178.graph_id = 0;
      }
      else {
        local_118._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar3->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar8) + 0xa0);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar8);
        local_118._16_8_ = *(undefined8 *)(lVar4 + 0x80);
        local_118._24_8_ = *(undefined8 *)(lVar4 + 0x88);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar8);
        local_118._48_8_ = *(undefined8 *)(lVar4 + 0x90);
        local_118._56_8_ = *(undefined8 *)(lVar4 + 0x98);
        local_118._64_8_ = local_b8;
        local_118._72_8_ = pCStack_b0;
        local_178.i = 5;
        local_178.graph_id = 0;
      }
      local_178.pg = (ComputationGraph *)local_118;
      local_118._40_8_ = puStack_190;
      local_118._32_8_ = local_198;
      local_148 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            ((initializer_list<dynet::Expression> *)&local_178);
      tanh((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (bVar10 && (bVar2 & 1U) == 0) {
        EVar11 = cmult(&local_168,&local_178);
      }
      else {
        local_118._0_16_ = (undefined1  [16])cmult(&local_168,&local_178);
        local_158 = cmult(&local_98,&local_88);
        EVar11 = operator+(&local_158,(Expression *)local_118);
      }
      pEVar5 = local_180[-1].
               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(ComputationGraph **)((long)&pEVar5->pg + lVar9) = EVar11.pg;
      *(long *)((long)&pEVar5->i + lVar9) = EVar11._8_8_;
      local_158 = (Expression)ZEXT816(0);
      if (bVar10 && (bVar2 & 1U) == 0) {
        local_118._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar3->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar8) + 0x70);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar8);
        local_118._16_8_ = *(undefined8 *)(lVar4 + 0x40);
        local_118._24_8_ = *(undefined8 *)(lVar4 + 0x48);
        local_118._32_8_ = local_198;
        local_118._40_8_ = puStack_190;
        local_128.i = 3;
        local_128.graph_id = 0;
        local_128.pg = (ComputationGraph *)local_118;
        local_158 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_128);
      }
      else {
        local_118._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar3->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar8) + 0x70);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar8);
        local_118._16_8_ = *(undefined8 *)(lVar4 + 0x40);
        local_118._24_8_ = *(undefined8 *)(lVar4 + 0x48);
        local_118._32_8_ = local_198;
        local_118._40_8_ = puStack_190;
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar8);
        local_118._48_8_ = *(undefined8 *)(lVar4 + 0x50);
        local_118._56_8_ = *(undefined8 *)(lVar4 + 0x58);
        local_118._64_8_ = local_b8;
        local_118._72_8_ = pCStack_b0;
        local_40._M_array = (iterator)local_118;
        local_40._M_len = 5;
        local_128 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              (&local_40);
        local_50 = cmult((Expression *)
                         (*(long *)((long)&(pvVar3->
                                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                           )._M_impl.super__Vector_impl_data + lVar8) + 0x60),
                         (Expression *)
                         ((long)&(local_180[-1].
                                  super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->pg + lVar9));
        local_158 = operator+(&local_128,&local_50);
      }
      uVar6 = local_a0;
      this = local_130;
      local_118._0_16_ = (undefined1  [16])logistic(&local_158);
      tanh((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      EVar11 = cmult((Expression *)local_118,&local_128);
      pEVar5 = local_a8[-1].
               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(ComputationGraph **)((long)&pEVar5->pg + lVar9) = EVar11.pg;
      *(long *)((long)&pEVar5->i + lVar9) = EVar11._8_8_;
      puVar1 = (undefined8 *)((long)&pEVar5->pg + lVar9);
      local_198 = (ComputationGraph *)*puVar1;
      puStack_190 = (pointer)puVar1[1];
      local_a0 = uVar6 + 1;
      lVar9 = lVar9 + 0x10;
      lVar8 = lVar8 + 0x18;
    } while (local_a0 < this->layers);
  }
  return local_a8[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

Expression FastLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state) {
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + cmult(vars[C2I], i_c_tm1);
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1}) +
              cmult(vars[C2I], i_c_tm1);
    } else {
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    }
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it,i_wt);
      Expression i_crt = cmult(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cmult(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state) {
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + cmult(vars[C2O], ct[i]);
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1}) +
              cmult(vars[C2O], ct[i]);
    }
    else {
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    }
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot,ph_t);
  }
  return ht.back();
}